

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_string.h
# Opt level: O3

int JetHead::split<std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
              char *split_chars,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *parts)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  strlen(split_chars);
  uVar1 = std::__cxx11::string::find_first_of((char *)str,(ulong)split_chars,0);
  do {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(parts,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar3 = uVar1 & 0xffffffff;
    do {
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      strlen(split_chars);
      uVar1 = std::__cxx11::string::find_first_of((char *)str,(ulong)split_chars,uVar3);
    } while (uVar2 == (uint)uVar1);
  } while( true );
}

Assistant:

int	split( const _string &str, const char *split_chars, JetHead::vector<_string> &parts )
	{
		unsigned pos = str.find_first_of( split_chars );
		unsigned start = 0;
		
		while ( pos != _string::npos )
		{
			parts.push_back( str.substr( start, pos - start ) );
			
			start = pos + 1;
			pos = str.find_first_of( split_chars, start );
			
			// if next char is also in split_chars, then search until we find a 
			//  char that is not.
			while( pos == start )
			{
				start = pos + 1;
				pos = str.find_first_of( split_chars, start );
			}
		}
		
		parts.push_back( str.substr( start, pos - start ) );
		
		return parts.size();
	}